

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::SampleShadingTests::init(SampleShadingTests *this,EVP_PKEY_CTX *ctx)

{
  RenderTarget target;
  int numSamples;
  Context *pCVar1;
  char *__s;
  TestNode *node;
  TestNode *pTVar2;
  MultisampleRenderCase *pMVar3;
  long *plVar4;
  long *extraout_RAX;
  long *plVar5;
  long lVar6;
  allocator<char> local_91;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  RenderTarget local_6c;
  long *local_68 [2];
  long local_58 [2];
  TestNode *local_48;
  long local_40;
  SampleShadingTests *local_38;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State query tests.");
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "min_sample_shading","Min sample shading tests.");
  tcu::TestNode::addChild((TestNode *)this,node);
  local_48 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"sample_shading_is_enabled","test SAMPLE_SHADING")
  ;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480a8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 2;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"sample_shading_get_boolean","test SAMPLE_SHADING"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480a8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"sample_shading_get_integer","test SAMPLE_SHADING"
            );
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480a8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 3;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"sample_shading_get_float","test SAMPLE_SHADING");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480a8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 5;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"sample_shading_get_integer64",
             "test SAMPLE_SHADING");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480a8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 4;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"min_sample_shading_value_get_boolean",
             "test MIN_SAMPLE_SHADING_VALUE");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480f8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 0;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"min_sample_shading_value_get_integer",
             "test MIN_SAMPLE_SHADING_VALUE");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480f8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 3;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"min_sample_shading_value_get_float",
             "test MIN_SAMPLE_SHADING_VALUE");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480f8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 5;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x80);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"min_sample_shading_value_get_integer64",
             "test MIN_SAMPLE_SHADING_VALUE");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b480f8;
  *(undefined4 *)&pTVar2[1].m_testCtx = 4;
  tcu::TestNode::addChild(node,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar2,pCVar1->m_testCtx,"min_sample_shading_value_clamping",
             "test MIN_SAMPLE_SHADING_VALUE clamping");
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b48148;
  tcu::TestNode::addChild(node,pTVar2);
  lVar6 = 8;
  local_38 = this;
  do {
    pMVar3 = (MultisampleRenderCase *)operator_new(0x130);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    __s = *(char **)((long)&init::targets[0].target + lVar6);
    local_40 = lVar6;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,__s,&local_91);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_68);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar4[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    target = *(RenderTarget *)(&UNK_00b47fe8 + local_40);
    numSamples = *(int *)(&UNK_00b47fec + local_40);
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar3,pCVar1,(char *)local_90,"Test multiple samples per pixel with color",
               numSamples,target,0x80,0);
    (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SampleShadingRenderingCase_00b48198;
    *(undefined4 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
    tcu::TestNode::addChild(local_48,(TestNode *)pMVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    this = local_38;
    local_6c = target;
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    pMVar3 = (MultisampleRenderCase *)operator_new(0x130);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_68,__s,&local_91);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_68);
    local_90 = &local_80;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_80 = *plVar5;
      lStack_78 = plVar4[3];
    }
    else {
      local_80 = *plVar5;
      local_90 = (long *)*plVar4;
    }
    local_88 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
              (pMVar3,pCVar1,(char *)local_90,"Test multiple samples per pixel with",numSamples,
               local_6c,0x80,0);
    (pMVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SampleShadingRenderingCase_00b48198;
    *(undefined4 *)&pMVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
    tcu::TestNode::addChild(local_48,(TestNode *)pMVar3);
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    lVar6 = local_40;
    plVar4 = local_58;
    if (local_68[0] != plVar4) {
      operator_delete(local_68[0],local_58[0] + 1);
      plVar4 = extraout_RAX;
    }
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x98);
  return (int)plVar4;
}

Assistant:

void SampleShadingTests::init (void)
{
	tcu::TestCaseGroup* const stateQueryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "State query tests.");
	tcu::TestCaseGroup* const minSamplesGroup = new tcu::TestCaseGroup(m_testCtx, "min_sample_shading", "Min sample shading tests.");

	addChild(stateQueryGroup);
	addChild(minSamplesGroup);

	// .state query
	{
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_is_enabled",				"test SAMPLE_SHADING",						QUERY_ISENABLED));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_boolean",				"test SAMPLE_SHADING",						QUERY_BOOLEAN));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_integer",				"test SAMPLE_SHADING",						QUERY_INTEGER));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_float",					"test SAMPLE_SHADING",						QUERY_FLOAT));
		stateQueryGroup->addChild(new SampleShadingStateCase			(m_context, "sample_shading_get_integer64",				"test SAMPLE_SHADING",						QUERY_INTEGER64));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_boolean",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_BOOLEAN));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_integer",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_INTEGER));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_float",		"test MIN_SAMPLE_SHADING_VALUE",			QUERY_FLOAT));
		stateQueryGroup->addChild(new MinSampleShadingValueCase			(m_context, "min_sample_shading_value_get_integer64",	"test MIN_SAMPLE_SHADING_VALUE",			QUERY_INTEGER64));
		stateQueryGroup->addChild(new MinSampleShadingValueClampingCase	(m_context, "min_sample_shading_value_clamping",		"test MIN_SAMPLE_SHADING_VALUE clamping"));
	}

	// .min_sample_count
	{
		static const struct Target
		{
			SampleShadingRenderingCase::RenderTarget	target;
			int											numSamples;
			const char*									name;
		} targets[] =
		{
			{ SampleShadingRenderingCase::TARGET_DEFAULT,			0,	"default_framebuffer"					},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			2,	"multisample_texture_samples_2"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			4,	"multisample_texture_samples_4"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			8,	"multisample_texture_samples_8"			},
			{ SampleShadingRenderingCase::TARGET_TEXTURE,			16,	"multisample_texture_samples_16"		},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		2,	"multisample_renderbuffer_samples_2"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		4,	"multisample_renderbuffer_samples_4"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		8,	"multisample_renderbuffer_samples_8"	},
			{ SampleShadingRenderingCase::TARGET_RENDERBUFFER,		16,	"multisample_renderbuffer_samples_16"	},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(targets); ++ndx)
		{
			minSamplesGroup->addChild(new SampleShadingRenderingCase(m_context, (std::string(targets[ndx].name) + "_color").c_str(),	"Test multiple samples per pixel with color",	targets[ndx].target, targets[ndx].numSamples, SampleShadingRenderingCase::TEST_COLOR));
			minSamplesGroup->addChild(new SampleShadingRenderingCase(m_context, (std::string(targets[ndx].name) + "_discard").c_str(),	"Test multiple samples per pixel with",			targets[ndx].target, targets[ndx].numSamples, SampleShadingRenderingCase::TEST_DISCARD));
		}
	}
}